

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

bool __thiscall LinearGE<1,_0>::propagate(LinearGE<1,_0> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  IntView<2> *pIVar4;
  IntVar *pIVar5;
  Lit *pLVar6;
  IntView<3> *pIVar7;
  long *plVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  Clause *pCVar12;
  int *piVar13;
  long unaff_RBP;
  size_t sVar14;
  vec<Lit> *pvVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int64_t iVar19;
  bool bVar20;
  Clause *local_50;
  vec<Lit> *local_48;
  ulong local_40;
  vec<Lit> *local_38;
  
  iVar19 = this->fix_sum;
  uVar1 = (this->x).sz;
  uVar2 = this->fix_x;
  uVar18 = (ulong)uVar2;
  if (uVar2 < uVar1) {
    piVar13 = &(this->x).data[uVar18].a;
    lVar11 = uVar1 - uVar18;
    do {
      iVar19 = iVar19 + (long)*piVar13 * (long)(((IntView<2> *)(piVar13 + -2))->var->max).v;
      piVar13 = piVar13 + 4;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  uVar1 = (this->y).sz;
  uVar3 = this->fix_y;
  if (uVar3 < uVar1) {
    lVar11 = (ulong)uVar1 - (ulong)uVar3;
    piVar13 = &(this->y).data[uVar3].a;
    do {
      iVar19 = iVar19 + (long)*piVar13 * -(long)(((IntView<3> *)(piVar13 + -2))->var->min).v;
      piVar13 = piVar13 + 4;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  if (uVar2 < (this->x).sz) {
    local_48 = &this->ps;
    do {
      pIVar4 = (this->x).data;
      unaff_RBP = uVar18 * 0x10;
      pIVar5 = pIVar4[uVar18].var;
      lVar11 = (long)pIVar4[uVar18].a;
      lVar16 = (pIVar5->max).v * lVar11 - iVar19;
      uVar17 = uVar18;
      if ((pIVar5->min).v * lVar11 < lVar16) {
        if (so.lazy == true) {
          local_40 = uVar18;
          if ((this->x).sz != 0) {
            lVar11 = 0;
            uVar17 = 0;
            do {
              iVar10 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar11) + 0x48))();
              (this->ps).data[uVar17].x = iVar10;
              uVar17 = uVar17 + 1;
              lVar11 = lVar11 + 0x10;
            } while (uVar17 < (this->x).sz);
          }
          if ((this->y).sz != 0) {
            lVar11 = 0;
            uVar17 = 0;
            do {
              iVar10 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar11) + 0x40))();
              (this->ps).data[(this->x).sz + (int)uVar17].x = iVar10;
              uVar17 = uVar17 + 1;
              lVar11 = lVar11 + 0x10;
            } while (uVar17 < (this->y).sz);
          }
          uVar17 = local_40;
          pLVar6 = (this->ps).data;
          pLVar6[local_40].x = pLVar6->x;
          uVar1 = (this->ps).sz;
          sVar14 = (ulong)(uVar1 - 1) * 4 + 8;
          if (uVar1 == 0) {
            sVar14 = 8;
          }
          pCVar12 = (Clause *)malloc(sVar14);
          Clause::Clause<vec<Lit>>(pCVar12,local_48,false);
          *(byte *)pCVar12 = *(byte *)pCVar12 | 2;
          local_50 = pCVar12;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_50);
          pCVar12 = local_50;
        }
        else {
          pCVar12 = (Clause *)0x0;
        }
        pIVar4 = (this->x).data;
        lVar16 = lVar16 + -1;
        lVar11 = (long)pIVar4[uVar18].a;
        pIVar5 = pIVar4[uVar18].var;
        iVar10 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xe])
                           (pIVar5,lVar16 / lVar11 + (lVar16 % lVar11 >> 0x3f) + 1,pCVar12,1);
        if ((char)iVar10 == '\0') {
          uVar18 = 0;
          goto LAB_001aa924;
        }
      }
      uVar18 = uVar17 + 1;
    } while (uVar18 < (this->x).sz);
  }
  uVar1 = this->fix_y;
  uVar17 = (ulong)uVar1;
  bVar20 = (this->y).sz <= uVar1;
  uVar18 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar20);
  if (!bVar20) {
    local_38 = &this->ps;
    do {
      pIVar7 = (this->y).data;
      pvVar15 = (vec<Lit> *)(uVar17 * 0x10);
      pIVar5 = pIVar7[uVar17].var;
      lVar11 = (long)pIVar7[uVar17].a;
      lVar16 = -(long)(pIVar5->min).v * lVar11 - iVar19;
      if (-(long)(pIVar5->max).v * lVar11 < lVar16) {
        if (so.lazy == true) {
          local_40 = CONCAT44(local_40._4_4_,(int)uVar18);
          local_48 = pvVar15;
          if ((this->x).sz != 0) {
            lVar11 = 0;
            uVar18 = 0;
            do {
              iVar10 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar11) + 0x48))();
              (this->ps).data[uVar18].x = iVar10;
              uVar18 = uVar18 + 1;
              lVar11 = lVar11 + 0x10;
            } while (uVar18 < (this->x).sz);
          }
          if ((this->y).sz != 0) {
            lVar11 = 0;
            uVar18 = 0;
            do {
              iVar10 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar11) + 0x40))();
              (this->ps).data[(this->x).sz + (int)uVar18].x = iVar10;
              uVar18 = uVar18 + 1;
              lVar11 = lVar11 + 0x10;
            } while (uVar18 < (this->y).sz);
          }
          pLVar6 = (this->ps).data;
          pLVar6[(this->x).sz + (int)uVar17].x = pLVar6->x;
          uVar1 = (this->ps).sz;
          sVar14 = (ulong)(uVar1 - 1) * 4 + 8;
          if (uVar1 == 0) {
            sVar14 = 8;
          }
          pCVar12 = (Clause *)malloc(sVar14);
          Clause::Clause<vec<Lit>>(pCVar12,local_38,false);
          *(byte *)pCVar12 = *(byte *)pCVar12 | 2;
          local_50 = pCVar12;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_50);
          uVar18 = local_40 & 0xffffffff;
          pCVar12 = local_50;
          pvVar15 = local_48;
        }
        else {
          pCVar12 = (Clause *)0x0;
        }
        pIVar7 = (this->y).data;
        lVar16 = lVar16 + -1;
        lVar11 = (long)*(int *)((long)&pIVar7->a + (long)pvVar15);
        plVar8 = *(long **)((long)&pvVar15->sz + (long)&pIVar7->var);
        cVar9 = (**(code **)(*plVar8 + 0x78))
                          (plVar8,~(lVar16 / lVar11) - (lVar16 % lVar11 >> 0x3f),pCVar12,1);
        if (cVar9 == '\0') break;
      }
      uVar17 = uVar17 + 1;
      bVar20 = uVar17 < (this->y).sz;
      uVar18 = CONCAT71((int7)(uVar18 >> 8),!bVar20);
    } while (bVar20);
  }
LAB_001aa924:
  return (bool)((byte)uVar18 & 1);
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}